

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_base64_output rf_decode_base64(uchar *input,rf_allocator allocator)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uchar *puVar5;
  rf_base64_output rVar6;
  uchar c_1;
  uchar b_2;
  uchar a_2;
  uchar b_1;
  uchar a_1;
  int n;
  uchar d;
  uchar c;
  uchar b;
  uchar a;
  rf_int i;
  uchar *input_local;
  rf_allocator allocator_local;
  rf_base64_output result;
  
  allocator_local.user_data = allocator.allocator_proc;
  input_local = (uchar *)allocator.user_data;
  allocator_local.allocator_proc._0_4_ = rf_get_size_base64(input);
  puVar5 = (uchar *)(*(code *)allocator_local.user_data)(&input_local,1);
  for (_n = 0; _n < (int)(uint)allocator_local.allocator_proc / 3; _n = _n + 1) {
    bVar1 = ""[(int)(uint)input[_n * 4 + 1]];
    bVar2 = ""[(int)(uint)input[_n * 4 + 2]];
    bVar3 = ""[(int)(uint)input[_n * 4 + 3]];
    puVar5[_n * 3] = ""[(int)(uint)input[_n * 4]] << 2 | (byte)((int)(uint)bVar1 >> 4);
    puVar5[_n * 3 + 1] = bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
    puVar5[_n * 3 + 2] = bVar2 << 6 | bVar3;
  }
  iVar4 = (int)(uint)allocator_local.allocator_proc / 3;
  if ((int)(uint)allocator_local.allocator_proc % 3 == 1) {
    puVar5[(int)((uint)allocator_local.allocator_proc - 1)] =
         ""[(int)(uint)input[iVar4 << 2]] << 2 |
         (byte)((int)(uint)""[(int)(uint)input[iVar4 * 4 + 1]] >> 4);
  }
  else if ((int)(uint)allocator_local.allocator_proc % 3 == 2) {
    bVar1 = ""[(int)(uint)input[iVar4 * 4 + 1]];
    bVar2 = ""[(int)(uint)input[iVar4 * 4 + 2]];
    puVar5[(int)((uint)allocator_local.allocator_proc - 2)] =
         ""[(int)(uint)input[iVar4 << 2]] << 2 | (byte)((int)(uint)bVar1 >> 4);
    puVar5[(int)((uint)allocator_local.allocator_proc - 1)] =
         bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
  }
  rVar6._4_4_ = 0;
  rVar6.size = (uint)allocator_local.allocator_proc;
  rVar6.buffer = puVar5;
  return rVar6;
}

Assistant:

RF_API rf_base64_output rf_decode_base64(const unsigned char* input, rf_allocator allocator)
{
    static const unsigned char rf_base64_table[] = {
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 62, 0, 0, 0, 63, 52, 53,
        54, 55, 56, 57, 58, 59, 60, 61, 0, 0,
        0, 0, 0, 0, 0, 0, 1, 2, 3, 4,
        5, 6, 7, 8, 9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24,
        25, 0, 0, 0, 0, 0, 0, 26, 27, 28,
        29, 30, 31, 32, 33, 34, 35, 36, 37, 38,
        39, 40, 41, 42, 43, 44, 45, 46, 47, 48,
        49, 50, 51
    };

    rf_base64_output result;
    result.size = rf_get_size_base64(input);
    result.buffer = RF_ALLOC(allocator, result.size);

    for (rf_int i = 0; i < result.size / 3; i++)
    {
        unsigned char a = rf_base64_table[(int) input[4 * i + 0]];
        unsigned char b = rf_base64_table[(int) input[4 * i + 1]];
        unsigned char c = rf_base64_table[(int) input[4 * i + 2]];
        unsigned char d = rf_base64_table[(int) input[4 * i + 3]];

        result.buffer[3 * i + 0] = (a << 2) | (b >> 4);
        result.buffer[3 * i + 1] = (b << 4) | (c >> 2);
        result.buffer[3 * i + 2] = (c << 6) | d;
    }

    int n = result.size / 3;

    if (result.size % 3 == 1)
    {
        unsigned char a = rf_base64_table[(int) input[4 * n + 0]];
        unsigned char b = rf_base64_table[(int) input[4 * n + 1]];

        result.buffer[result.size - 1] = (a << 2) | (b >> 4);
    } else if (result.size % 3 == 2)
    {
        unsigned char a = rf_base64_table[(int) input[4 * n + 0]];
        unsigned char b = rf_base64_table[(int) input[4 * n + 1]];
        unsigned char c = rf_base64_table[(int) input[4 * n + 2]];

        result.buffer[result.size - 2] = (a << 2) | (b >> 4);
        result.buffer[result.size - 1] = (b << 4) | (c >> 2);
    }

    return result;
}